

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

void google::protobuf::compiler::Version::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  Nullable<const_char_*> failure_msg;
  Arena *arena;
  Version *_this;
  Version *local_28;
  MessageLite *local_20 [2];
  
  local_28 = (Version *)to_msg;
  local_20[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::compiler::Version_const*,google::protobuf::compiler::Version*>
                          ((Version **)local_20,&local_28,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x244,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_20)
    ;
  }
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      uVar2 = from_msg[1]._internal_metadata_.ptr_;
      (local_28->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_28->field_0)._impl_._has_bits_.has_bits_[0] | 1;
      arena = (Arena *)(local_28->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
      }
      protobuf::internal::ArenaStringPtr::Set<>
                (&(local_28->field_0)._impl_.suffix_,(string *)(uVar2 & 0xfffffffffffffffc),arena);
    }
    if ((uVar1 & 2) != 0) {
      *(undefined4 *)((long)&local_28->field_0 + 0x10) =
           *(undefined4 *)&from_msg[2]._vptr_MessageLite;
    }
    if ((uVar1 & 4) != 0) {
      (local_28->field_0)._impl_.minor_ = *(int32_t *)((long)&from_msg[2]._vptr_MessageLite + 4);
    }
    if ((uVar1 & 8) != 0) {
      *(int *)((long)&local_28->field_0 + 0x18) = (int)from_msg[2]._internal_metadata_.ptr_;
    }
  }
  (local_28->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_28->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
  protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_28->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void Version::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Version*>(&to_msg);
  auto& from = static_cast<const Version&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.compiler.Version)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_suffix(from._internal_suffix());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.major_ = from._impl_.major_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.minor_ = from._impl_.minor_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.patch_ = from._impl_.patch_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}